

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void free_cdef_bufs_conditional
               (AV1_COMMON *cm,uint16_t **colbuf,uint16_t **srcbuf,size_t *new_colbuf_size,
               size_t new_srcbuf_size)

{
  void *memblk;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int plane;
  CdefInfo *cdef_info;
  int local_34;
  
  memblk = (void *)(in_RDI + 0x5bc0);
  if (in_R8 != *(long *)(in_RDI + 0x5c28)) {
    aom_free(memblk);
    *in_RDX = 0;
  }
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    if (*(long *)(in_RCX + (long)local_34 * 8) !=
        *(long *)((long)memblk + (long)local_34 * 8 + 0x38)) {
      aom_free(memblk);
      *(undefined8 *)(in_RSI + (long)local_34 * 8) = 0;
    }
  }
  return;
}

Assistant:

static inline void free_cdef_bufs_conditional(AV1_COMMON *const cm,
                                              uint16_t **colbuf,
                                              uint16_t **srcbuf,
                                              const size_t *new_colbuf_size,
                                              const size_t new_srcbuf_size) {
  CdefInfo *cdef_info = &cm->cdef_info;
  if (new_srcbuf_size != cdef_info->allocated_srcbuf_size) {
    aom_free(*srcbuf);
    *srcbuf = NULL;
  }
  for (int plane = 0; plane < MAX_MB_PLANE; plane++) {
    if (new_colbuf_size[plane] != cdef_info->allocated_colbuf_size[plane]) {
      aom_free(colbuf[plane]);
      colbuf[plane] = NULL;
    }
  }
}